

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr input)

{
  Builder result;
  Reader expression_00;
  bool bVar1;
  Parsers *pPVar2;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *other;
  Orphan<capnp::compiler::Expression> *pOVar3;
  SourceFile *pSVar4;
  NullableValue<capnp::compiler::Compiler::CompiledType> *other_00;
  CompiledType *pCVar5;
  NullableValue<capnp::Type> *other_01;
  Type *pTVar6;
  size_t sVar7;
  size_t sVar8;
  ArrayPtr<const_char> input_00;
  Orphanage orphanageParam;
  Iterator IVar9;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar10;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  end;
  bool local_9aa;
  Fault local_868;
  Fault f_1;
  bool local_851;
  undefined1 auStack_850 [7];
  bool _kjCondition_1;
  Reader local_840;
  ArrayPtr<const_char> local_810;
  Reader *local_800;
  uint local_7f8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_7f0;
  Reader *local_7e0;
  uint local_7d8;
  undefined1 local_7d0 [8];
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  best;
  Reader local_7b0;
  ArrayPtr<const_char> local_780;
  ArrayPtr<const_char> local_770;
  Schema local_760;
  Type *local_758;
  Type *type;
  undefined1 local_738 [8];
  NullableValue<capnp::Type> _type1252;
  CompiledType *compiledType;
  CapTableReader *pCStack_710;
  void *local_708;
  WirePointer *pWStack_700;
  StructDataBitCount local_6f8;
  StructPointerCount SStack_6f4;
  undefined2 uStack_6f2;
  int iStack_6f0;
  undefined4 uStack_6ec;
  Maybe<capnp::compiler::Compiler::CompiledType> local_6e8;
  undefined1 local_628 [8];
  NullableValue<capnp::compiler::Compiler::CompiledType> _compiledType1251;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_558;
  Reader *local_548;
  uint local_540;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_538;
  Orphan<capnp::compiler::Expression> *local_528;
  Orphan<capnp::compiler::Expression> *expression;
  undefined1 local_4f8 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> _expression1246;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_4b0;
  Reader *local_4a0;
  uint local_498;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_490;
  bool local_479;
  Reader *pRStack_478;
  bool success;
  uint local_470;
  Reader *local_468;
  uint local_460;
  Reader *local_458;
  uint local_450;
  Reader *local_448;
  uint local_440;
  undefined1 local_438 [8];
  ParserInput parserInput;
  undefined1 local_3d0 [8];
  Reader tokens;
  undefined1 local_390 [8];
  CapnpParser parser;
  undefined1 auStack_1c0 [8];
  Builder lexedTokens;
  MallocMessageBuilder tokenArena;
  CliArgumentErrorReporter errorReporter;
  Fault local_70;
  Fault f;
  size_t local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  CompilerMain *this_local;
  StringPtr input_local;
  
  input_local.content.ptr = (char *)input.content.size_;
  this_local = (CompilerMain *)input.content.ptr;
  _kjCondition._32_8_ = this;
  input_local.content.size_ = (size_t)__return_storage_ptr__;
  local_60 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::size(&this->sourceFiles);
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception._4_4_ = 1;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_50,&local_58,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4b0,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_50);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  setRootType::CliArgumentErrorReporter::CliArgumentErrorReporter
            ((CliArgumentErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&lexedTokens._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            ((Builder *)auStack_1c0,(MessageBuilder *)&lexedTokens._builder.dataSize);
  input_00 = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&this_local);
  parser.parsers.annotationDecl.wrapper = (Wrapper *)auStack_1c0;
  result._builder.capTable = (CapTableBuilder *)lexedTokens._builder.segment;
  result._builder.segment = (SegmentBuilder *)auStack_1c0;
  result._builder.data = lexedTokens._builder.capTable;
  result._builder.pointers = (WirePointer *)lexedTokens._builder.data;
  result._builder._32_8_ = lexedTokens._builder.pointers;
  lex(input_00,result,(ErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  orphanageParam = MessageBuilder::getOrphanage((MessageBuilder *)&lexedTokens._builder.dataSize);
  tokens.reader._40_8_ = orphanageParam.arena;
  CapnpParser::CapnpParser
            ((CapnpParser *)local_390,orphanageParam,
             (ErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  LexedTokens::Builder::asReader((Reader *)&parserInput.best.index,(Builder *)auStack_1c0);
  LexedTokens::Reader::getTokens((Reader *)local_3d0,(Reader *)&parserInput.best.index);
  IVar9 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin((Reader *)local_3d0);
  local_458 = IVar9.container;
  local_450 = IVar9.index;
  local_448 = local_458;
  local_440 = local_450;
  IVar9 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_3d0);
  pRStack_478 = IVar9.container;
  local_470 = IVar9.index;
  IVar10.index = local_440;
  IVar10.container = local_448;
  IVar10._12_4_ = 0;
  end._12_4_ = 0;
  end.container = (Reader *)SUB128(IVar9._0_12_,0);
  end.index = SUB124(IVar9._0_12_,8);
  local_468 = pRStack_478;
  local_460 = local_470;
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                   *)local_438,IVar10,end);
  local_479 = false;
  IVar10 = kj::parse::
           IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
           ::getPosition((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                          *)local_438);
  local_4a0 = IVar10.container;
  local_498 = IVar10.index;
  local_490.container = local_4a0;
  local_490.index = local_498;
  IVar9 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_3d0);
  local_4b0.container = IVar9.container;
  local_4b0.index = IVar9.index;
  bVar1 = capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
          ::operator==(&local_490,&local_4b0);
  if (bVar1) {
    kj::StringPtr::StringPtr
              ((StringPtr *)&_expression1246.field_1.value.builder.location,
               "Couldn\'t parse type name.");
    setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj::
    StringPtr_(&tokenArena.moreSegments.builder.disposer,0,0,(StringPtr)stack0xfffffffffffffb30);
  }
  else {
    pPVar2 = CapnpParser::getParsers((CapnpParser *)local_390);
    kj::parse::
    ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
    ::operator()((Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)&expression,
                 &pPVar2->expression,
                 (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                  *)local_438);
    other = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Expression>>
                      ((Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)&expression);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)local_4f8,other);
    kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>::~Maybe
              ((Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)&expression);
    pOVar3 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_4f8);
    if (pOVar3 == (Orphan<capnp::compiler::Expression> *)0x0) {
      IVar10 = kj::parse::
               IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
               ::getBest((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                          *)local_438);
      local_7e0 = IVar10.container;
      local_7d8 = IVar10.index;
      local_7d0 = (undefined1  [8])local_7e0;
      best.container._0_4_ = local_7d8;
      IVar9 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_3d0);
      local_800 = IVar9.container;
      local_7f8 = IVar9.index;
      local_7f0.container = local_800;
      local_7f0.index = local_7f8;
      bVar1 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
              ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                            *)local_7d0,&local_7f0);
      if (bVar1) {
        sVar7 = kj::StringPtr::size((StringPtr *)&this_local);
        sVar8 = kj::StringPtr::size((StringPtr *)&this_local);
        kj::StringPtr::StringPtr((StringPtr *)&local_810,"Couldn\'t parse type name.");
        setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj
        ::StringPtr_(&tokenArena.moreSegments.builder.disposer,(uint32_t)sVar7,(uint32_t)sVar8,
                     (StringPtr)local_810);
      }
      else {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator*(&local_840,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                     *)local_7d0);
        kj::StringPtr::StringPtr((StringPtr *)auStack_850,"Couldn\'t parse type name.");
        ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
                  ((ErrorReporter *)&tokenArena.moreSegments.builder.disposer,&local_840,
                   (StringPtr)_auStack_850);
      }
    }
    else {
      local_528 = kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::operator*
                            ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)local_4f8
                            );
      IVar10 = kj::parse::
               IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
               ::getPosition((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                              *)local_438);
      local_548 = IVar10.container;
      local_540 = IVar10.index;
      local_538.container = local_548;
      local_538.index = local_540;
      IVar9 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_3d0);
      _compiledType1251.field_1._176_8_ = IVar9.container;
      local_558.index = IVar9.index;
      local_558.container = (Reader *)_compiledType1251.field_1._176_8_;
      bVar1 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
              ::operator==(&local_538,&local_558);
      if (bVar1) {
        pSVar4 = kj::Vector<capnp::compiler::CompilerMain::SourceFile>::operator[]
                           (&this->sourceFiles,0);
        Orphan<capnp::compiler::Expression>::getReader
                  ((ReaderFor<capnp::compiler::Expression> *)&compiledType,local_528);
        expression_00._reader.capTable = pCStack_710;
        expression_00._reader.segment = (SegmentReader *)compiledType;
        expression_00._reader.data = local_708;
        expression_00._reader.pointers = pWStack_700;
        expression_00._reader.dataSize = local_6f8;
        expression_00._reader.pointerCount = SStack_6f4;
        expression_00._reader._38_2_ = uStack_6f2;
        expression_00._reader.nestingLimit = iStack_6f0;
        expression_00._reader._44_4_ = uStack_6ec;
        Compiler::ModuleScope::evalType
                  (&local_6e8,&pSVar4->compiled,expression_00,
                   (ErrorReporter *)&tokenArena.moreSegments.builder.disposer);
        other_00 = kj::_::readMaybe<capnp::compiler::Compiler::CompiledType>(&local_6e8);
        kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::NullableValue
                  ((NullableValue<capnp::compiler::Compiler::CompiledType> *)local_628,other_00);
        kj::Maybe<capnp::compiler::Compiler::CompiledType>::~Maybe(&local_6e8);
        pCVar5 = kj::_::NullableValue::operator_cast_to_CompiledType_((NullableValue *)local_628);
        if (pCVar5 != (CompiledType *)0x0) {
          _type1252.field_1.value.field_4 =
               (anon_union_8_2_eba6ea51_for_Type_5)
               kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::operator*
                         ((NullableValue<capnp::compiler::Compiler::CompiledType> *)local_628);
          Compiler::CompiledType::getSchema
                    ((Maybe<capnp::Type> *)&type,(CompiledType *)_type1252.field_1.value.field_4);
          other_01 = kj::_::readMaybe<capnp::Type>((Maybe<capnp::Type> *)&type);
          kj::_::NullableValue<capnp::Type>::NullableValue
                    ((NullableValue<capnp::Type> *)local_738,other_01);
          kj::Maybe<capnp::Type>::~Maybe((Maybe<capnp::Type> *)&type);
          pTVar6 = kj::_::NullableValue::operator_cast_to_Type_((NullableValue *)local_738);
          if (pTVar6 == (Type *)0x0) {
            kj::StringPtr::StringPtr((StringPtr *)&local_780,"Type is not a struct.");
            setRootType(kj::StringPtr)::CliArgumentErrorReporter::
            addError(unsigned_int,unsigned_int,kj::StringPtr_
                      (&tokenArena.moreSegments.builder.disposer,0,0,(StringPtr)local_780);
          }
          else {
            local_758 = kj::_::NullableValue<capnp::Type>::operator*
                                  ((NullableValue<capnp::Type> *)local_738);
            bVar1 = capnp::Type::isStruct(local_758);
            if (bVar1) {
              local_760.raw = (RawBrandedSchema *)capnp::Type::asStruct(local_758);
              (this->rootType).super_Schema.raw = local_760.raw;
              local_479 = true;
            }
            else {
              kj::StringPtr::StringPtr((StringPtr *)&local_770,"Type is not a struct.");
              setRootType(kj::StringPtr)::CliArgumentErrorReporter::
              addError(unsigned_int,unsigned_int,kj::StringPtr_
                        (&tokenArena.moreSegments.builder.disposer,0,0,(StringPtr)local_770);
            }
          }
          kj::_::NullableValue<capnp::Type>::~NullableValue((NullableValue<capnp::Type> *)local_738)
          ;
        }
        kj::_::NullableValue<capnp::compiler::Compiler::CompiledType>::~NullableValue
                  ((NullableValue<capnp::compiler::Compiler::CompiledType> *)local_628);
      }
      else {
        kj::parse::
        IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        ::current(&local_7b0,
                  (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                   *)local_438);
        kj::StringPtr::StringPtr((StringPtr *)&best.index,"Couldn\'t parse type name.");
        ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
                  ((ErrorReporter *)&tokenArena.moreSegments.builder.disposer,&local_7b0,
                   (StringPtr)stack0xfffffffffffff840);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)local_4f8);
  }
  f_1.exception =
       (Exception *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_479);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f_1);
  local_9aa = true;
  if (!bVar1) {
    local_9aa = setRootType::CliArgumentErrorReporter::hadErrors
                          ((CliArgumentErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  }
  local_851 = local_9aa;
  if (local_9aa == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              (&local_868,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4fd,FAILED,"success || errorReporter.hadErrors()","_kjCondition,",&local_851);
    kj::_::Debug::Fault::fatal(&local_868);
  }
  setRootType::CliArgumentErrorReporter::getValidity
            (__return_storage_ptr__,
             (CliArgumentErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                    *)local_438);
  CapnpParser::~CapnpParser((CapnpParser *)local_390);
  MallocMessageBuilder::~MallocMessageBuilder
            ((MallocMessageBuilder *)&lexedTokens._builder.dataSize);
  setRootType::CliArgumentErrorReporter::~CliArgumentErrorReporter
            ((CliArgumentErrorReporter *)&tokenArena.moreSegments.builder.disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr input) {
    KJ_ASSERT(sourceFiles.size() == 1);

    class CliArgumentErrorReporter: public ErrorReporter {
    public:
      void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }

      bool hadErrors() override {
        return error != kj::none;
      }

      kj::MainBuilder::Validity getValidity() {
        KJ_IF_SOME(e, error) {
          return kj::mv(e);
        } else {
          return true;
        }
      }

    private:
      kj::Maybe<kj::String> error;
    };

    CliArgumentErrorReporter errorReporter;

    capnp::MallocMessageBuilder tokenArena;
    auto lexedTokens = tokenArena.initRoot<capnp::compiler::LexedTokens>();
    lex(input, lexedTokens, errorReporter);

    CapnpParser parser(tokenArena.getOrphanage(), errorReporter);
    auto tokens = lexedTokens.asReader().getTokens();
    CapnpParser::ParserInput parserInput(tokens.begin(), tokens.end());

    bool success = false;

    if (parserInput.getPosition() == tokens.end()) {
      // Empty argument?
      errorReporter.addError(0, 0, "Couldn't parse type name.");
    } else {
      KJ_IF_SOME(expression, parser.getParsers().expression(parserInput)) {
        // The input is expected to contain a *single* expression.
        if (parserInput.getPosition() == tokens.end()) {
          // Hooray, now parse it.
          KJ_IF_SOME(compiledType,
              sourceFiles[0].compiled.evalType(expression.getReader(), errorReporter)) {
            KJ_IF_SOME(type, compiledType.getSchema()) {
              if (type.isStruct()) {
                rootType = type.asStruct();
                success = true;
              } else {
                errorReporter.addError(0, 0, "Type is not a struct.");
              }
            } else {
              // Apparently named a file scope.
              errorReporter.addError(0, 0, "Type is not a struct.");
            }
          }
        } else {
          errorReporter.addErrorOn(parserInput.current(), "Couldn't parse type name.");
        }
      }